

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportTargetCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target)

{
  cmTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  reference pvVar4;
  string local_d8;
  undefined1 local_b8 [8];
  string config;
  string local_90;
  string local_60;
  string local_40 [8];
  string targetName;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportInstallAndroidMKGenerator *this_local;
  
  targetName.field_2._8_8_ = target;
  std::__cxx11::string::string
            (local_40,(string *)
                      &(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.
                       Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_
            (&local_60,(cmGeneratorTarget *)targetName.field_2._8_8_);
  std::__cxx11::string::operator+=(local_40,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar2 = std::operator<<(os,local_40);
  std::operator<<(poVar2,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/");
  this_00 = *(cmTarget **)targetName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"__dest",(allocator *)(config.field_2._M_local_buf + 0xf));
  pcVar3 = cmTarget::GetProperty(this_00,&local_90);
  poVar2 = std::operator<<(os,pcVar3);
  std::operator<<(poVar2,"/");
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)(config.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_b8);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.
                   Configurations);
  if (!bVar1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.
                           Configurations,0);
    std::__cxx11::string::operator=((string *)local_b8,(string *)pvVar4);
  }
  cmGeneratorTarget::GetFullName
            (&local_d8,(cmGeneratorTarget *)targetName.field_2._8_8_,(string *)local_b8,
             RuntimeBinaryArtifact);
  poVar2 = std::operator<<(os,(string *)&local_d8);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, const cmGeneratorTarget* target)
{
  std::string targetName = this->Namespace;
  targetName += target->GetExportName();
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := $(_IMPORT_PREFIX)/";
  os << target->Target->GetProperty("__dest") << "/";
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  os << target->GetFullName(config) << "\n";
}